

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall duckdb::Executor::Reset(Executor *this)

{
  _Head_base<0UL,_duckdb::PhysicalOperator_*,_false> _Var1;
  
  ::std::mutex::lock(&this->executor_lock);
  _Var1._M_head_impl =
       (this->owned_plan).
       super_unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
       .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl;
  (this->physical_plan).ptr = (PhysicalOperator *)0x0;
  (this->owned_plan).
  super_unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
  .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl = (PhysicalOperator *)0x0;
  this->cancelled = false;
  if (_Var1._M_head_impl != (PhysicalOperator *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_PhysicalOperator + 8))();
  }
  ::std::__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>::
  reset((__uniq_ptr_impl<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_> *
        )&this->root_executor,(pointer)0x0);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ::clear(&(this->root_pipelines).
           super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
         );
  this->root_pipeline_idx = 0;
  LOCK();
  (this->completed_pipelines).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  this->total_pipelines = 0;
  TaskErrorManager::Reset(&this->error_manager);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ::clear(&(this->pipelines).
           super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
         );
  ::std::
  vector<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
  ::clear(&(this->events).
           super_vector<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
         );
  ::std::
  _Hashtable<duckdb::Task_*,_std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Task_*>,_std::hash<duckdb::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->to_be_rescheduled_tasks)._M_h);
  this->execution_result = RESULT_NOT_READY;
  pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
  return;
}

Assistant:

void Executor::Reset() {
	lock_guard<mutex> elock(executor_lock);
	physical_plan = nullptr;
	cancelled = false;
	owned_plan.reset();
	root_executor.reset();
	root_pipelines.clear();
	root_pipeline_idx = 0;
	completed_pipelines = 0;
	total_pipelines = 0;
	error_manager.Reset();
	pipelines.clear();
	events.clear();
	to_be_rescheduled_tasks.clear();
	execution_result = PendingExecutionResult::RESULT_NOT_READY;
}